

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall soul::AST::Block::getParentFunction(Block *this)

{
  getParentFunction(this);
  return;
}

Assistant:

pool_ptr<Function> getParentFunction() const override
        {
            if (isFunctionMainBlock())
                return functionForWhichThisIsMain;

            return Scope::getParentFunction();
        }